

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O2

void __thiscall soul::Structure::removeMember(Structure *this,string_view memberName)

{
  _Hash_node_base *p_Var1;
  __node_base *p_Var2;
  allocator<char> local_51;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40 [32];
  
  local_50._M_str = memberName._M_str;
  local_50._M_len = memberName._M_len;
  p_Var1 = (_Hash_node_base *)getMemberIndex(this,memberName);
  p_Var2 = &(this->memberIndexMap)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    if (p_Var1 <= p_Var2[5]._M_nxt) {
      p_Var2[5]._M_nxt = (_Hash_node_base *)((long)&p_Var2[5]._M_nxt[-1]._M_nxt + 7);
    }
  }
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_40,&local_50,&local_51);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_erase(&(this->memberIndexMap)._M_h,local_40);
  std::__cxx11::string::~string(local_40);
  ArrayWithPreallocation<soul::Structure::Member,_8UL>::erase
            (&this->members,(this->members).items + (long)p_Var1);
  return;
}

Assistant:

void Structure::removeMember (std::string_view memberName)
{
    auto i = getMemberIndex (memberName);

    for (auto& m : memberIndexMap)
        if (m.second >= i)
            m.second--;

    memberIndexMap.erase (std::string (memberName));
    members.erase (members.begin() + i);
}